

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O0

void __thiscall helics::udp::UdpComms::UdpComms(UdpComms *this)

{
  future<int> *in_RDI;
  thread_generation in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  NetworkCommsInterface *in_stack_ffffffffffffffc0;
  future<int> *this_00;
  promise<int> *in_stack_ffffffffffffffe0;
  
  NetworkCommsInterface::NetworkCommsInterface
            (in_stack_ffffffffffffffc0,(InterfaceTypes)((uint)in_stack_ffffffffffffffbc >> 0x18),
             in_stack_ffffffffffffffb8);
  (in_RDI->super___basic_future<int>)._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__UdpComms_00926ac8;
  this_00 = in_RDI + 0x4c;
  std::promise<int>::promise(in_stack_ffffffffffffffe0);
  std::future<int>::future((future<int> *)0x39f65b);
  std::promise<int>::get_future
            ((promise<int> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::future<int>::operator=(this_00,in_RDI);
  std::future<int>::~future((future<int> *)0x39f693);
  return;
}

Assistant:

UdpComms::UdpComms(): NetworkCommsInterface(gmlc::networking::InterfaceTypes::UDP)
{
    futurePort = promisePort.get_future();
}